

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O2

void google::protobuf::internal::
     AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::DescriptorPool::MemoBase>
               (MemoBase *from)

{
  long lVar1;
  
  if (from != (MemoBase *)0x0) {
    lVar1 = __dynamic_cast(from,&DescriptorPool::MemoBase::typeinfo,
                           &DescriptorPool::
                            MemoData<std::basic_string_view<char,std::char_traits<char>>>::typeinfo,
                           0);
    if (lVar1 == 0) {
      __assert_fail("from == nullptr || dynamic_cast<To*>(from) != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/port.h"
                    ,0xbf,
                    "void google::protobuf::internal::AssertDownCast(From *) [To = const google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char>>, From = google::protobuf::DescriptorPool::MemoBase]"
                   );
    }
  }
  return;
}

Assistant:

void AssertDownCast(From* from) {
  static_assert(std::is_base_of<From, To>::value, "illegal DownCast");

  // Check that this function is not used to downcast message types.
  // For those we should use {Down,Dynamic}CastTo{Message,Generated}.
  static_assert(!std::is_base_of_v<MessageLite, To>);

#if PROTOBUF_RTTI
  // RTTI: debug mode only!
  assert(from == nullptr || dynamic_cast<To*>(from) != nullptr);
#endif
}